

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

int __thiscall ON_BinaryArchive::Read3dmDimStyle(ON_BinaryArchive *this,ON_DimStyle **ppDimStyle)

{
  uint uVar1;
  ON_DimStyle *src;
  bool bVar2;
  bool bVar3;
  ON_DimStyle *pOVar4;
  int iVar5;
  
  if (ppDimStyle != (ON_DimStyle **)0x0) {
    *ppDimStyle = (ON_DimStyle *)0x0;
  }
  if ((this->m_archive_dim_style_table_status == 1) &&
     (this->m_archive_dim_style_table_read_index < 0xfffffffe)) {
    pOVar4 = (ON_DimStyle *)0x0;
    do {
      uVar1 = this->m_archive_dim_style_table_read_index;
      if ((uint)(this->m_archive_dim_style_table).m_count <= uVar1) break;
      this->m_archive_dim_style_table_read_index = uVar1 + 1;
      src = (this->m_archive_dim_style_table).m_a[uVar1];
      bVar2 = true;
      if (src != (ON_DimStyle *)0x0) {
        bVar3 = ON_ModelComponent::ParentIdIsNotNil(&src->super_ON_ModelComponent);
        if (!bVar3) {
          pOVar4 = (ON_DimStyle *)operator_new(0x450);
          ON_DimStyle::ON_DimStyle(pOVar4,src);
          (this->m_archive_dim_style_table).m_a[uVar1] = pOVar4;
          ON_3dmAnnotationContext::UpdateReferencedDimStyle(&this->m_annotation_context,src,pOVar4);
          if (src == this->m_archive_current_dim_style) {
            this->m_archive_current_dim_style = pOVar4;
          }
          bVar2 = false;
          pOVar4 = src;
        }
      }
    } while (bVar2);
    if (pOVar4 == (ON_DimStyle *)0x0) {
      this->m_archive_dim_style_table_read_index = 0xfffffffe;
      iVar5 = 0;
    }
    else {
      iVar5 = 1;
      if (ppDimStyle != (ON_DimStyle **)0x0) {
        *ppDimStyle = pOVar4;
      }
    }
  }
  else {
    iVar5 = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x2c11,"",
               "All calls to Read3dmDimStyle() must be after a single call to BeginRead3dmDimStyleTable() and before a single call to EndRead3dmDimStyleTable()."
              );
  }
  return iVar5;
}

Assistant:

int ON_BinaryArchive::Read3dmDimStyle(
  class ON_DimStyle** ppDimStyle
)
{
  if (nullptr != ppDimStyle)
    *ppDimStyle = nullptr;

  if (1 != m_archive_dim_style_table_status || m_archive_dim_style_table_read_index >= ON_UNSET_UINT_INDEX - 1)
  {
    ON_ERROR("All calls to Read3dmDimStyle() must be after a single call to BeginRead3dmDimStyleTable() and before a single call to EndRead3dmDimStyleTable().");
    return 0;
  }

  ON_DimStyle* dim_style = nullptr;
  while (m_archive_dim_style_table_read_index < m_archive_dim_style_table.UnsignedCount())
  {
    const unsigned int i = m_archive_dim_style_table_read_index++;
    ON_DimStyle* archive_dim_style = m_archive_dim_style_table[i];
    if (nullptr == archive_dim_style)
      continue;
    if (archive_dim_style->ParentIdIsNotNil())
      continue;

    ON_DimStyle* managed_dim_style = new ON_DimStyle(*archive_dim_style);
    m_archive_dim_style_table[i] = managed_dim_style;
    m_annotation_context.UpdateReferencedDimStyle(archive_dim_style, managed_dim_style);
    if (archive_dim_style == m_archive_current_dim_style)
      m_archive_current_dim_style = managed_dim_style;
    dim_style = archive_dim_style;
    break;
  }

  if (nullptr == dim_style)
  {
    m_archive_dim_style_table_read_index = ON_UNSET_UINT_INDEX - 1;
    return 0;
  }

  if (nullptr != ppDimStyle)
    *ppDimStyle = dim_style;

  return 1;
}